

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int verify_finished(ptls_t *tls,ptls_iovec_t message)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int ret;
  uint8_t verify_data [64];
  int local_5c;
  undefined1 local_58 [64];
  long local_18;
  long local_10;
  
  if (*(long *)(*(long *)(*(long *)(in_RDI + 0x50) + 0x58) + 8) + 4 == in_RDX) {
    local_18 = in_RDI;
    local_10 = in_RSI;
    local_5c = calc_verify_data((void *)verify_data._56_8_,(ptls_key_schedule_t *)verify_data._48_8_
                                ,(void *)verify_data._40_8_);
    if ((local_5c == 0) &&
       (iVar1 = (*ptls_mem_equal)((void *)(local_10 + 4),local_58,
                                  *(size_t *)(*(long *)(*(long *)(local_18 + 0x50) + 0x58) + 8)),
       iVar1 == 0)) {
      local_5c = 0x28;
    }
  }
  else {
    local_5c = 0x32;
  }
  (*ptls_clear_memory)(local_58,0x40);
  return local_5c;
}

Assistant:

static int verify_finished(ptls_t *tls, ptls_iovec_t message)
{
    uint8_t verify_data[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if (PTLS_HANDSHAKE_HEADER_SIZE + tls->key_schedule->hashes[0].algo->digest_size != message.len) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }

    if ((ret = calc_verify_data(verify_data, tls->key_schedule, tls->traffic_protection.dec.secret)) != 0)
        goto Exit;
    if (!ptls_mem_equal(message.base + PTLS_HANDSHAKE_HEADER_SIZE, verify_data, tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        goto Exit;
    }

Exit:
    ptls_clear_memory(verify_data, sizeof(verify_data));
    return ret;
}